

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O3

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QWidget *pQVar1;
  QVBoxLayout *this_00;
  QPushButton *this_01;
  QHBoxLayout *pQVar2;
  QLabel *pQVar3;
  QSpacerItem *pQVar4;
  GameBoard *this_02;
  QMenuBar *this_03;
  QStatusBar *this_04;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QArrayData *local_48;
  undefined8 uStack_40;
  long local_38;
  
  QObject::objectName();
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  if (local_38 == 0) {
    QVar17.m_data = (storage_type *)0xa;
    QVar17.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar17);
    QObject::setObjectName((QString *)MainWindow);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
  }
  local_48 = (QArrayData *)&DAT_1d700000250;
  QWidget::resize((QSize *)MainWindow);
  pQVar1 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar1,MainWindow,0);
  this->centralwidget = pQVar1;
  QVar5.m_data = (storage_type *)0xd;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)pQVar1);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  this_00 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_00,this->centralwidget);
  this->verticalLayout = this_00;
  QVar6.m_data = (storage_type *)0xe;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)this_00);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  this_01 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(this_01,this->centralwidget);
  this->beginNewGameButton = this_01;
  QVar7.m_data = (storage_type *)0x12;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)this_01);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QBoxLayout::addWidget(this->verticalLayout,this->beginNewGameButton,0,0);
  pQVar2 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar2);
  this->horizontalLayout = pQVar2;
  QVar8.m_data = (storage_type *)0x10;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar2);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  pQVar3 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar3,this->centralwidget,0);
  this->player1Label = pQVar3;
  QVar9.m_data = (storage_type *)0xc;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar3);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->player1Label,0));
  QBoxLayout::addWidget(this->horizontalLayout,this->player1Label,0,0);
  pQVar3 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar3,this->centralwidget,0);
  this->player1Score = pQVar3;
  QVar10.m_data = (storage_type *)0xc;
  QVar10.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar3);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->player1Score,0));
  QBoxLayout::addWidget(this->horizontalLayout,this->player1Score,0,0);
  pQVar4 = (QSpacerItem *)operator_new(0x28);
  *(code **)pQVar4 = QObject::objectName;
  *(undefined8 *)(pQVar4 + 8) = 0x2800000000;
  *(undefined8 *)(pQVar4 + 0x10) = 0x17000000000014;
  *(undefined4 *)(pQVar4 + 0x18) = 0;
  *(undefined4 *)(pQVar4 + 0x1c) = 0;
  *(undefined4 *)(pQVar4 + 0x20) = 0xffffffff;
  *(undefined4 *)(pQVar4 + 0x24) = 0xffffffff;
  this->horizontalSpacer = pQVar4;
  (**(code **)(*(long *)this->horizontalLayout + 0x80))(this->horizontalLayout,pQVar4);
  QBoxLayout::addLayout((QLayout *)this->verticalLayout,(int)this->horizontalLayout);
  pQVar2 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar2);
  this->horizontalLayout_2 = pQVar2;
  QVar11.m_data = (storage_type *)0x12;
  QVar11.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar2);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  pQVar3 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar3,this->centralwidget,0);
  this->player2Label = pQVar3;
  QVar12.m_data = (storage_type *)0xc;
  QVar12.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)pQVar3);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QBoxLayout::addWidget(this->horizontalLayout_2,this->player2Label,0,0);
  pQVar3 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar3,this->centralwidget,0);
  this->player2Score = pQVar3;
  QVar13.m_data = (storage_type *)0xc;
  QVar13.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar13);
  QObject::setObjectName((QString *)pQVar3);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->player2Score,0));
  QBoxLayout::addWidget(this->horizontalLayout_2,this->player2Score,0,0);
  pQVar4 = (QSpacerItem *)operator_new(0x28);
  *(code **)pQVar4 = QObject::objectName;
  *(undefined8 *)(pQVar4 + 8) = 0x2800000000;
  *(undefined8 *)(pQVar4 + 0x10) = 0x17000000000014;
  *(undefined4 *)(pQVar4 + 0x18) = 0;
  *(undefined4 *)(pQVar4 + 0x1c) = 0;
  *(undefined4 *)(pQVar4 + 0x20) = 0xffffffff;
  *(undefined4 *)(pQVar4 + 0x24) = 0xffffffff;
  this->horizontalSpacer_2 = pQVar4;
  (**(code **)(*(long *)this->horizontalLayout_2 + 0x80))(this->horizontalLayout_2,pQVar4);
  QBoxLayout::addLayout((QLayout *)this->verticalLayout,(int)this->horizontalLayout_2);
  this_02 = (GameBoard *)operator_new(0x70);
  GameBoard::GameBoard(this_02,this->centralwidget);
  this->gameBoard = this_02;
  QVar14.m_data = (storage_type *)0x9;
  QVar14.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar14);
  QObject::setObjectName((QString *)this_02);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QBoxLayout::addWidget(this->verticalLayout,this->gameBoard,0,0);
  QMainWindow::setCentralWidget((QWidget *)MainWindow);
  this_03 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(this_03,(QWidget *)MainWindow);
  this->menubar = this_03;
  QVar15.m_data = (storage_type *)0x7;
  QVar15.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar15);
  QObject::setObjectName((QString *)this_03);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  local_48 = (QArrayData *)0x0;
  uStack_40 = 0x150000024f;
  QWidget::setGeometry((QRect *)this->menubar);
  QMainWindow::setMenuBar((QMenuBar *)MainWindow);
  this_04 = (QStatusBar *)operator_new(0x28);
  QStatusBar::QStatusBar(this_04,(QWidget *)MainWindow);
  this->statusbar = this_04;
  QVar16.m_data = (storage_type *)0x9;
  QVar16.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar16);
  QObject::setObjectName((QString *)this_04);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QMainWindow::setStatusBar((QStatusBar *)MainWindow);
  retranslateUi(this,MainWindow);
  QMetaObject::connectSlotsByName((QObject *)MainWindow);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(592, 471);
        centralwidget = new QWidget(MainWindow);
        centralwidget->setObjectName(QString::fromUtf8("centralwidget"));
        verticalLayout = new QVBoxLayout(centralwidget);
        verticalLayout->setObjectName(QString::fromUtf8("verticalLayout"));
        beginNewGameButton = new QPushButton(centralwidget);
        beginNewGameButton->setObjectName(QString::fromUtf8("beginNewGameButton"));

        verticalLayout->addWidget(beginNewGameButton);

        horizontalLayout = new QHBoxLayout();
        horizontalLayout->setObjectName(QString::fromUtf8("horizontalLayout"));
        player1Label = new QLabel(centralwidget);
        player1Label->setObjectName(QString::fromUtf8("player1Label"));
        QSizePolicy sizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(player1Label->sizePolicy().hasHeightForWidth());
        player1Label->setSizePolicy(sizePolicy);

        horizontalLayout->addWidget(player1Label);

        player1Score = new QLabel(centralwidget);
        player1Score->setObjectName(QString::fromUtf8("player1Score"));
        sizePolicy.setHeightForWidth(player1Score->sizePolicy().hasHeightForWidth());
        player1Score->setSizePolicy(sizePolicy);

        horizontalLayout->addWidget(player1Score);

        horizontalSpacer = new QSpacerItem(40, 20, QSizePolicy::Expanding, QSizePolicy::Minimum);

        horizontalLayout->addItem(horizontalSpacer);


        verticalLayout->addLayout(horizontalLayout);

        horizontalLayout_2 = new QHBoxLayout();
        horizontalLayout_2->setObjectName(QString::fromUtf8("horizontalLayout_2"));
        player2Label = new QLabel(centralwidget);
        player2Label->setObjectName(QString::fromUtf8("player2Label"));

        horizontalLayout_2->addWidget(player2Label);

        player2Score = new QLabel(centralwidget);
        player2Score->setObjectName(QString::fromUtf8("player2Score"));
        sizePolicy.setHeightForWidth(player2Score->sizePolicy().hasHeightForWidth());
        player2Score->setSizePolicy(sizePolicy);

        horizontalLayout_2->addWidget(player2Score);

        horizontalSpacer_2 = new QSpacerItem(40, 20, QSizePolicy::Expanding, QSizePolicy::Minimum);

        horizontalLayout_2->addItem(horizontalSpacer_2);


        verticalLayout->addLayout(horizontalLayout_2);

        gameBoard = new GameBoard(centralwidget);
        gameBoard->setObjectName(QString::fromUtf8("gameBoard"));

        verticalLayout->addWidget(gameBoard);

        MainWindow->setCentralWidget(centralwidget);
        menubar = new QMenuBar(MainWindow);
        menubar->setObjectName(QString::fromUtf8("menubar"));
        menubar->setGeometry(QRect(0, 0, 592, 22));
        MainWindow->setMenuBar(menubar);
        statusbar = new QStatusBar(MainWindow);
        statusbar->setObjectName(QString::fromUtf8("statusbar"));
        MainWindow->setStatusBar(statusbar);

        retranslateUi(MainWindow);

        QMetaObject::connectSlotsByName(MainWindow);
    }